

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O0

vm_obj_id_t CVmDynamicFunc::get_obj_from_prefix(uchar *p)

{
  int iVar1;
  CVmObject *this;
  CVmObjTable *pCVar2;
  CVmObjTable *in_RDI;
  CVmDynamicFunc *co;
  vm_obj_id_t id;
  undefined4 local_4;
  
  local_4 = vmb_get_objid((char *)0x32e867);
  iVar1 = CVmObjTable::is_obj_id_valid(in_RDI,local_4);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    iVar1 = is_dynfunc_obj(0);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      this = vm_objp(0);
      get_ext((CVmDynamicFunc *)this);
      pCVar2 = (CVmObjTable *)vm_dynfunc_ext::get_bytecode_ptr((vm_dynfunc_ext *)0x32e8c2);
      if (pCVar2 != in_RDI) {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

vm_obj_id_t CVmDynamicFunc::get_obj_from_prefix(VMG_ const uchar *p)
{
    /* 
     *   A DynamicFunc stores a method header prefix just before the start of
     *   the header, and the prefix stores the associated DynamicFunc ID.
     *   Read the prefix header.
     *   
     *   (Technically, this has some risk of reading outside the bounds of
     *   valid program memory, because we don't know the origin of 'p'.
     *   Callers should never attempt calling this routine with arbitrary
     *   pointers.  Only pass in pointers that are known to refer to valid
     *   method headers, AND that aren't part of the static Code Pool.  The
     *   only other kind of valid method header pointer is a DynamicFunc, so
     *   as long as callers obey these rules this dereference should be
     *   safe.)  
     */
    vm_obj_id_t id = vmb_get_objid((const char *)p - VMCO_PREFIX_LENGTH);

    /* verify with the memory manager that this is a valid object ID */
    if (!G_obj_table->is_obj_id_valid(id))
        return VM_INVALID_OBJ;

    /* it's a valid object; make sure it's really of type DynamicFunc */
    if (!is_dynfunc_obj(vmg_ id))
        return VM_INVALID_OBJ;

    /* 
     *   It's a valid DynamicFunc: verify that it's really the one it claims
     *   to be.  If it is, the object's bytecode pointer should match 'p'.  
     */
    CVmDynamicFunc *co = (CVmDynamicFunc *)vm_objp(vmg_ id);
    if (co->get_ext()->get_bytecode_ptr() == (const char *)p)
    {
        /* we have a winner! */
        return id;
    }

    /* it's not our object */
    return VM_INVALID_OBJ;
}